

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O3

int __thiscall pg::PSISolver::mark_solved_seq(PSISolver *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  lVar3 = done;
  lVar2 = won;
  lVar1 = ((this->super_Solver).game)->n_vertices;
  if (0 < lVar1) {
    lVar5 = 0;
    iVar4 = 0;
    do {
      if (*(int *)(lVar3 + lVar5 * 4) == 2) {
        iVar4 = iVar4 + 1;
        *(undefined4 *)(lVar2 + lVar5 * 4) = 1;
        *(undefined4 *)(lVar3 + lVar5 * 4) = 3;
      }
      lVar5 = lVar5 + 1;
    } while (lVar1 != lVar5);
    return iVar4;
  }
  return 0;
}

Assistant:

int
PSISolver::mark_solved_seq(void)
{
    int res = 0;
    for (int n=0; n<nodecount(); n++) {
        if (done[n] == 2) { // done[n] == 3 proxies disabled and won
            won[n] = 1;
            done[n] = 3; // mark as won
            res++;
        }
    }
    return res;
}